

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

Offset __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128Space
          (BinaryWriter *this,Offset leb_size_guess,char *desc)

{
  size_t sVar1;
  size_t local_48;
  Offset bytes_to_write;
  Offset result;
  char *pcStack_20;
  uint8_t data [5];
  char *desc_local;
  Offset leb_size_guess_local;
  BinaryWriter *this_local;
  
  pcStack_20 = desc;
  if (5 < leb_size_guess) {
    __assert_fail("leb_size_guess <= MAX_U32_LEB128_BYTES",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                  ,0xc5,
                  "Offset wabt::(anonymous namespace)::BinaryWriter::WriteU32Leb128Space(Offset, const char *)"
                 );
  }
  memset((void *)((long)&result + 3),0,5);
  sVar1 = Stream::offset(this->stream_);
  local_48 = leb_size_guess;
  if ((this->options_->canonicalize_lebs & 1U) == 0) {
    local_48 = 5;
  }
  Stream::WriteData(this->stream_,(void *)((long)&result + 3),local_48,pcStack_20,No);
  return sVar1;
}

Assistant:

Offset BinaryWriter::WriteU32Leb128Space(Offset leb_size_guess,
                                         const char* desc) {
  assert(leb_size_guess <= MAX_U32_LEB128_BYTES);
  uint8_t data[MAX_U32_LEB128_BYTES] = {0};
  Offset result = stream_->offset();
  Offset bytes_to_write =
      options_.canonicalize_lebs ? leb_size_guess : MAX_U32_LEB128_BYTES;
  stream_->WriteData(data, bytes_to_write, desc);
  return result;
}